

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Erat.cpp
# Opt level: O3

void __thiscall primesieve::Erat::preSieve(Erat *this)

{
  ulong uVar1;
  byte *pbVar2;
  
  PreSieve::preSieve(&this->sieve_,this->segmentLow_);
  uVar1 = this->start_;
  if (this->segmentLow_ <= uVar1) {
    pbVar2 = (this->sieve_).array_;
    *pbVar2 = *pbVar2 & (anonymous_namespace)::unsetSmaller[uVar1 + ((uVar1 - 7) / 0x1e) * -0x1e];
  }
  return;
}

Assistant:

void Erat::preSieve()
{
  PreSieve::preSieve(sieve_, segmentLow_);

  // unset bits < start
  if (segmentLow_ <= start_)
  {
    uint64_t rem = byteRemainder(start_);
    sieve_[0] &= unsetSmaller[rem];
  }
}